

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O0

void __thiscall
QBalloonTip::QBalloonTip
          (QBalloonTip *this,QIcon *icon,QString *title,QString *message,QSystemTrayIcon *ti)

{
  double dVar1;
  int iVar2;
  int iVar3;
  QWidget *pQVar4;
  QFont *pQVar5;
  char *pcVar6;
  QStyle *pQVar7;
  QWidget *this_00;
  QLabelPrivate *pQVar8;
  QTextDocument *pQVar9;
  ulong uVar10;
  QPalette *pQVar11;
  Mode in_ESI;
  char *in_RDI;
  char *in_R8;
  long in_FS_OFFSET;
  QLabel *iconLabel;
  QGridLayout *layout;
  QWidgetTextControl *control;
  int limit;
  QLabel *msgLabel;
  QPushButton *closeButton;
  int closeButtonSize;
  int iconSize;
  QLabel *titleLabel;
  QTextOption opt;
  QPalette pal;
  QFont f;
  Policy in_stack_fffffffffffffdb8;
  Policy in_stack_fffffffffffffdbc;
  QWidget *in_stack_fffffffffffffdc0;
  QWidget *this_01;
  QWidget *in_stack_fffffffffffffdc8;
  QWidget *in_stack_fffffffffffffdd0;
  QString *in_stack_fffffffffffffdd8;
  QFlagsStorage<Qt::WindowType> f_00;
  int in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  QWidget *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  GlobalColor fromColumn;
  int in_stack_fffffffffffffdf4;
  QWidget *in_stack_fffffffffffffdf8;
  QWidget *in_stack_fffffffffffffe00;
  QPalette *this_02;
  QWidget *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe20;
  QWidget *in_stack_fffffffffffffe28;
  QLabelPrivate *in_stack_fffffffffffffe58;
  QFlagsStorage<Qt::AlignmentFlag> QVar12;
  undefined1 local_ec [4];
  undefined1 local_e8 [4];
  undefined1 local_e4 [4];
  undefined1 local_e0 [8];
  QPixmap local_d8 [28];
  undefined1 local_bc [4];
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined8 local_9c;
  undefined8 local_94;
  QRect local_8c;
  undefined1 local_7c [4];
  Connection local_78 [2];
  QIcon local_68;
  undefined1 local_5c [4];
  Connection local_58 [2];
  QColor local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<Qt::WindowType>::QFlags
            ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
  QWidget::QWidget(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)
                   SUB84((ulong)in_stack_fffffffffffffdd8 >> 0x20,0));
  *(undefined ***)in_RDI = &PTR_metaObject_00d0b0b8;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QBalloonTip_00d0b268;
  *(char **)(in_RDI + 0x28) = in_R8;
  QPixmap::QPixmap((QPixmap *)(in_RDI + 0x30));
  QBasicTimer::QBasicTimer((QBasicTimer *)(in_RDI + 0x48));
  in_RDI[0x4c] = '\x01';
  QWidget::setAttribute
            (in_stack_fffffffffffffe28,(WidgetAttribute)((ulong)in_stack_fffffffffffffe20 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe20 >> 0x18,0));
  QObject::connect((QObject *)local_58,in_R8,(QObject *)"2destroyed()",in_RDI,0xab1e6e);
  QMetaObject::Connection::~Connection(local_58);
  pQVar4 = (QWidget *)operator_new(0x28);
  memset(local_5c,0,4);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x4913d4);
  QLabel::QLabel((QLabel *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)
                 SUB84((ulong)in_stack_fffffffffffffdd8 >> 0x20,0));
  QObject::installEventFilter((QObject *)pQVar4);
  QLabel::setText((QLabel *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  in_stack_fffffffffffffdd8);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = QWidget::font(pQVar4);
  QFont::QFont((QFont *)&local_18,pQVar5);
  QFont::setBold((QFont *)in_stack_fffffffffffffdc0,SUB41(in_stack_fffffffffffffdbc >> 0x18,0));
  QWidget::setFont(in_stack_fffffffffffffde8,
                   (QFont *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  QLabel::setTextFormat
            ((QLabel *)in_stack_fffffffffffffdd0,
             (TextFormat)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  pcVar6 = (char *)operator_new(0x28);
  QPushButton::QPushButton((QPushButton *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  (**(code **)(*(long *)pQVar7 + 0x100))(&local_68,pQVar7,3,0);
  QAbstractButton::setIcon
            ((QAbstractButton *)in_stack_fffffffffffffdd0,(QIcon *)in_stack_fffffffffffffdc8);
  QIcon::~QIcon(&local_68);
  QSize::QSize((QSize *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
               in_stack_fffffffffffffdb8);
  QAbstractButton::setIconSize
            ((QAbstractButton *)in_stack_fffffffffffffdd0,(QSize *)in_stack_fffffffffffffdc8);
  QWidget::setSizePolicy
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
  QWidget::setFixedSize
            (in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
             (int)in_stack_fffffffffffffdd8);
  QObject::connect((QObject *)local_78,pcVar6,(QObject *)"2clicked()",in_RDI,0xab1e6e);
  QMetaObject::Connection::~Connection(local_78);
  this_00 = (QWidget *)operator_new(0x28);
  memset(local_7c,0,4);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x491607);
  QLabel::QLabel((QLabel *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)
                 SUB84((ulong)in_stack_fffffffffffffdd8 >> 0x20,0));
  QObject::installEventFilter((QObject *)this_00);
  QLabel::setText((QLabel *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  in_stack_fffffffffffffdd8);
  QLabel::setTextFormat
            ((QLabel *)in_stack_fffffffffffffdd0,
             (TextFormat)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  pQVar4 = this_00;
  Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                (enum_type)in_stack_fffffffffffffdc0);
  QVar12.i = (Int)((ulong)pQVar4 >> 0x20);
  QLabel::setAlignment
            ((QLabel *)in_stack_fffffffffffffdd0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             SUB84((ulong)in_stack_fffffffffffffde8 >> 0x20,0));
  local_8c = QWidgetPrivate::availableScreenGeometry(in_stack_fffffffffffffdd0);
  iVar2 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  iVar2 = iVar2 / 3;
  local_94 = (**(code **)(*(long *)this_00 + 0x70))();
  iVar3 = QSize::width((QSize *)0x4916fe);
  if (iVar2 < iVar3) {
    QLabel::setWordWrap((QLabel *)in_stack_fffffffffffffdc0,
                        SUB41(in_stack_fffffffffffffdbc >> 0x18,0));
    local_9c = (**(code **)(*(long *)this_00 + 0x70))();
    iVar3 = QSize::width((QSize *)0x491740);
    if (iVar2 < iVar3) {
      QLabel::d_func((QLabel *)0x49175a);
      QLabelPrivate::ensureTextControl(in_stack_fffffffffffffe58);
      pQVar8 = QLabel::d_func((QLabel *)0x49176f);
      if (pQVar8->control != (QWidgetTextControl *)0x0) {
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        local_b0 = 0xffffffffffffffff;
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        QWidgetTextControl::document((QWidgetTextControl *)in_stack_fffffffffffffdc0);
        QTextDocument::defaultTextOption();
        QTextOption::setWrapMode((QTextOption *)&local_b8,WrapAnywhere);
        pQVar9 = QWidgetTextControl::document((QWidgetTextControl *)in_stack_fffffffffffffdc0);
        QTextDocument::setDefaultTextOption((QTextOption *)pQVar9);
        QTextOption::~QTextOption((QTextOption *)&local_b8);
      }
    }
    (**(code **)(*(long *)this_00 + 0x80))(this_00,iVar2);
    QWidget::setFixedSize
              (in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
               (int)in_stack_fffffffffffffdd8);
  }
  f_00.i = (Int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  pQVar4 = (QWidget *)operator_new(0x20);
  QGridLayout::QGridLayout((QGridLayout *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  uVar10 = QIcon::isNull();
  if ((uVar10 & 1) == 0) {
    operator_new(0x28);
    memset(local_bc,0,4);
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x4918d4);
    QLabel::QLabel((QLabel *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(WindowFlags)f_00.i
                  );
    QSize::QSize((QSize *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                 in_stack_fffffffffffffdb8);
    dVar1 = (double)QPaintDevice::devicePixelRatio();
    QIcon::pixmap((QSize *)local_d8,dVar1,in_ESI,(State)local_e0);
    QLabel::setPixmap((QLabel *)in_stack_fffffffffffffde8,
                      (QPixmap *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    QPixmap::~QPixmap(local_d8);
    QWidget::setSizePolicy
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
    QLabel::setMargin((QLabel *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
    memset(local_e4,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x4919d7);
    QGridLayout::addWidget
              ((QGridLayout *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),(int)in_stack_fffffffffffffdf8,
               (Alignment)QVar12.i);
    memset(local_e8,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x491a36);
    QGridLayout::addWidget
              ((QGridLayout *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),(int)in_stack_fffffffffffffdf8,
               (Alignment)QVar12.i);
  }
  else {
    in_stack_fffffffffffffe08 = pQVar4;
    memset(local_ec,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x491a97);
    QGridLayout::addWidget
              ((QGridLayout *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,
               (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)in_stack_fffffffffffffde8,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffe08 >> 0x20,0));
  }
  this_01 = pQVar4;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x491af2);
  iVar3 = 0;
  fromColumn = black;
  QGridLayout::addWidget
            ((QGridLayout *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
             (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),(int)in_stack_fffffffffffffdf8,
             (Alignment)QVar12.i);
  QVar12.i = (Int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x491b4a);
  iVar2 = 3;
  QGridLayout::addWidget
            ((QGridLayout *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,iVar3,fromColumn,
             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)in_stack_fffffffffffffde8,
             (Alignment)QVar12.i);
  QLayout::setSizeConstraint((QLayout *)pQVar4,(SizeConstraint)((ulong)pcVar6 >> 0x20));
  QLayout::setContentsMargins
            ((QLayout *)pQVar4,(int)((ulong)pcVar6 >> 0x20),(int)pcVar6,
             (int)((ulong)this_01 >> 0x20),(int)this_01);
  QWidget::setLayout(in_stack_fffffffffffffdf8,(QLayout *)CONCAT44(iVar3,fromColumn));
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar11 = QWidget::palette(this_01);
  this_02 = (QPalette *)local_28;
  QPalette::QPalette(this_02,(QPalette *)pQVar11);
  QColor::QColor((QColor *)CONCAT44(iVar3,fromColumn),(int)((ulong)local_38 >> 0x20),(int)local_38,
                 iVar2,in_stack_fffffffffffffde0);
  QPalette::setColor((QPalette *)this_01,in_stack_fffffffffffffdbc,(QColor *)0x491c26);
  QColor::QColor(&local_48,fromColumn);
  QPalette::setColor((QPalette *)this_01,in_stack_fffffffffffffdbc,(QColor *)0x491c4f);
  QWidget::setPalette(this_00,(QPalette *)pQVar4);
  QPalette::~QPalette(this_02);
  QFont::~QFont((QFont *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QBalloonTip::QBalloonTip(const QIcon &icon, const QString &title,
                         const QString &message, QSystemTrayIcon *ti)
    : QWidget(nullptr, Qt::ToolTip),
      trayIcon(ti),
      showArrow(true)
{
    setAttribute(Qt::WA_DeleteOnClose);
    QObject::connect(ti, SIGNAL(destroyed()), this, SLOT(close()));

#if QT_CONFIG(label)
    QLabel *titleLabel = new QLabel;
    titleLabel->installEventFilter(this);
    titleLabel->setText(title);
    QFont f = titleLabel->font();
    f.setBold(true);
    titleLabel->setFont(f);
    titleLabel->setTextFormat(Qt::PlainText); // to maintain compat with windows
#endif

    const int iconSize = 18;
    const int closeButtonSize = 15;

#if QT_CONFIG(pushbutton)
    QPushButton *closeButton = new QPushButton;
    closeButton->setIcon(style()->standardIcon(QStyle::SP_TitleBarCloseButton));
    closeButton->setIconSize(QSize(closeButtonSize, closeButtonSize));
    closeButton->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed);
    closeButton->setFixedSize(closeButtonSize, closeButtonSize);
    QObject::connect(closeButton, SIGNAL(clicked()), this, SLOT(close()));
#else
    Q_UNUSED(closeButtonSize);
#endif

#if QT_CONFIG(label)
    QLabel *msgLabel = new QLabel;
    msgLabel->installEventFilter(this);
    msgLabel->setText(message);
    msgLabel->setTextFormat(Qt::PlainText);
    msgLabel->setAlignment(Qt::AlignTop | Qt::AlignLeft);

    // smart size for the message label
    int limit = QWidgetPrivate::availableScreenGeometry(msgLabel).width() / 3;
    if (msgLabel->sizeHint().width() > limit) {
        msgLabel->setWordWrap(true);
        if (msgLabel->sizeHint().width() > limit) {
            msgLabel->d_func()->ensureTextControl();
            if (QWidgetTextControl *control = msgLabel->d_func()->control) {
                QTextOption opt = control->document()->defaultTextOption();
                opt.setWrapMode(QTextOption::WrapAnywhere);
                control->document()->setDefaultTextOption(opt);
            }
        }
        // Here we allow the text being much smaller than the balloon widget
        // to emulate the weird standard windows behavior.
        msgLabel->setFixedSize(limit, msgLabel->heightForWidth(limit));
    }
#endif

    QGridLayout *layout = new QGridLayout;
#if QT_CONFIG(label)
    if (!icon.isNull()) {
        QLabel *iconLabel = new QLabel;
        iconLabel->setPixmap(icon.pixmap(QSize(iconSize, iconSize), devicePixelRatio()));
        iconLabel->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed);
        iconLabel->setMargin(2);
        layout->addWidget(iconLabel, 0, 0);
        layout->addWidget(titleLabel, 0, 1);
    } else {
        layout->addWidget(titleLabel, 0, 0, 1, 2);
    }
#endif

#if QT_CONFIG(pushbutton)
    layout->addWidget(closeButton, 0, 2);
#endif

#if QT_CONFIG(label)
    layout->addWidget(msgLabel, 1, 0, 1, 3);
#endif
    layout->setSizeConstraint(QLayout::SetFixedSize);
    layout->setContentsMargins(3, 3, 3, 3);
    setLayout(layout);

    QPalette pal = palette();
    pal.setColor(QPalette::Window, QColor(0xff, 0xff, 0xe1));
    pal.setColor(QPalette::WindowText, Qt::black);
    setPalette(pal);
}